

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcDebug.c
# Opt level: O2

int Abc_NtkFindGivenFanin(Abc_Ntk_t *pNtk,int Step,Abc_Obj_t **ppObj,Abc_Obj_t **ppFanin)

{
  Abc_Obj_t *pNode;
  uint uVar1;
  int iVar2;
  Abc_Obj_t *pAVar3;
  int iVar4;
  long lVar5;
  int i;
  
  i = 0;
  iVar4 = 0;
  do {
    if (pNtk->vObjs->nSize <= i) {
      return 0;
    }
    pAVar3 = Abc_NtkObj(pNtk,i);
    if (pAVar3 != (Abc_Obj_t *)0x0) {
      for (lVar5 = 0; lVar5 < (pAVar3->vFanins).nSize; lVar5 = lVar5 + 1) {
        pNode = (Abc_Obj_t *)pAVar3->pNtk->vObjs->pArray[(pAVar3->vFanins).pArray[lVar5]];
        uVar1 = *(uint *)&pAVar3->field_0x14 & 0xf;
        if (uVar1 == 7) {
          iVar2 = Abc_NodeIsConst(pNode);
          if (iVar2 == 0) goto LAB_0027587d;
        }
        else if ((uVar1 == 3) && (pNtk->vPos->nSize != 1)) {
LAB_0027587d:
          if (iVar4 == Step) {
            *ppObj = pAVar3;
            *ppFanin = pNode;
            return 1;
          }
          iVar4 = iVar4 + 1;
        }
      }
    }
    i = i + 1;
  } while( true );
}

Assistant:

int Abc_NtkFindGivenFanin( Abc_Ntk_t * pNtk, int Step, Abc_Obj_t ** ppObj, Abc_Obj_t ** ppFanin )
{
    Abc_Obj_t * pObj, * pFanin;
    int i, k, Counter = 0;
    Abc_NtkForEachObj( pNtk, pObj, i )
        Abc_ObjForEachFanin( pObj, pFanin, k )
        {
            if ( !Abc_ObjIsNode(pObj) && !Abc_ObjIsPo(pObj) )
                continue;
            if ( Abc_ObjIsPo(pObj) && Abc_NtkPoNum(pNtk) == 1 )
                continue;
            if ( Abc_ObjIsNode(pObj) && Abc_NodeIsConst(pFanin) )
                continue;
            if ( Counter++ == Step )
            {
                *ppObj   = pObj;
                *ppFanin = pFanin;
                return 1;
            }
        }
    return 0;
}